

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::NewKey
          (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
           *this,FName *key)

{
  char *pcVar1;
  undefined4 uVar2;
  FName FVar3;
  undefined4 uVar4;
  Node *pNVar5;
  Node *pNVar6;
  uint uVar7;
  Node *pNVar8;
  Node *pNVar9;
  FName local_1c;
  
  uVar7 = this->Size - 1 & key->Index;
  pNVar6 = this->Nodes + uVar7;
  if (this->Nodes[uVar7].Next != (Node *)0x1) {
    pNVar5 = GetFreePos(this);
    if (pNVar5 == (Node *)0x0) {
      Rehash(this);
      local_1c = (FName)key->Index;
      pNVar6 = NewKey(this,&local_1c);
      return pNVar6;
    }
    pNVar9 = this->Nodes + (this->Size - 1 & (pNVar6->Pair).Key.Index);
    if (this->Nodes + (this->Size - 1 & (pNVar6->Pair).Key.Index) == pNVar6) {
      pNVar5->Next = pNVar6->Next;
      pNVar9 = pNVar5;
      goto LAB_0031cc43;
    }
    do {
      pNVar8 = pNVar9;
      pNVar9 = pNVar8->Next;
    } while (pNVar9 != pNVar6);
    pNVar8->Next = pNVar5;
    pNVar9 = pNVar6->Next;
    FVar3.Index = (pNVar6->Pair).Key.Index;
    uVar4 = *(undefined4 *)&(pNVar6->Pair).field_0x4;
    uVar2 = *(undefined4 *)&(pNVar6->Pair).Value.field_0x4;
    pcVar1 = (pNVar6->Pair).Value.args.Chars;
    (pNVar5->Pair).Value.device = (pNVar6->Pair).Value.device;
    *(undefined4 *)&(pNVar5->Pair).Value.field_0x4 = uVar2;
    (pNVar5->Pair).Value.args.Chars = pcVar1;
    pNVar5->Next = pNVar9;
    (pNVar5->Pair).Key = (FName)FVar3.Index;
    *(undefined4 *)&(pNVar5->Pair).field_0x4 = uVar4;
  }
  pNVar5 = (Node *)0x0;
  pNVar9 = pNVar6;
LAB_0031cc43:
  pNVar6->Next = pNVar5;
  this->NumUsed = this->NumUsed + 1;
  (pNVar9->Pair).Key.Index = key->Index;
  return pNVar9;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}